

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O2

bool __thiscall
Memory::SegmentBase<Memory::VirtualAllocWrapper>::Initialize
          (SegmentBase<Memory::VirtualAllocWrapper> *this,DWORD allocFlags,bool excludeGuardPages)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  undefined4 *puVar4;
  size_t sVar5;
  PageAllocatorBaseCommon *pPVar6;
  code *pcVar7;
  bool bVar8;
  bool bVar9;
  char cVar10;
  uint uVar11;
  UINT_PTR UVar12;
  char *lpAddress;
  AllocatorType *pAVar13;
  PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
  *pPVar14;
  ulong pageCount;
  undefined8 *in_FS_OFFSET;
  
  if (this->address != (char *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)*in_FS_OFFSET;
    *puVar4 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x58,"(this->address == nullptr)","this->address == nullptr");
    if (!bVar8) goto LAB_002755ec;
    *puVar4 = 0;
  }
  if ((excludeGuardPages) ||
     ((this->segmentPageCount << 0xc < 0x100001 && ((Js::Configuration::Global[0x5f71] & 1) == 0))))
  {
    bVar8 = false;
  }
  else {
    UVar12 = Math::Rand();
    this->leadingGuardPageCount = (int)((UVar12 & 0xffffffff) % 0xf) + 1;
    this->trailingGuardPageCount = 1;
    bVar8 = true;
  }
  uVar2 = this->trailingGuardPageCount;
  uVar3 = this->leadingGuardPageCount;
  sVar5 = this->segmentPageCount;
  uVar11 = AutoSystemInfo::GetAllocationGranularityPageCount(&AutoSystemInfo::Data);
  pageCount = -(ulong)uVar11 & ((ulong)uVar11 + uVar3 + sVar5 + (ulong)uVar2) - 1;
  this->segmentPageCount = pageCount - (this->trailingGuardPageCount + this->leadingGuardPageCount);
  pPVar6 = (this->super_SegmentBaseCommon).allocator;
  pPVar14 = (PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
             *)&pPVar6[-1].allocatorType;
  if (pPVar6 == (PageAllocatorBaseCommon *)0x0) {
    pPVar14 = (PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
               *)0x0;
  }
  bVar9 = PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
          ::RequestAlloc(pPVar14,pageCount << 0xc);
  if (bVar9) {
    pPVar6 = (this->super_SegmentBaseCommon).allocator;
    pPVar14 = (PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
               *)&pPVar6[-1].allocatorType;
    if (pPVar6 == (PageAllocatorBaseCommon *)0x0) {
      pPVar14 = (PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                 *)0x0;
    }
    PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
    ::GetVirtualAllocator(pPVar14);
    pPVar6 = (this->super_SegmentBaseCommon).allocator;
    pAVar13 = &pPVar6[-1].allocatorType;
    if (pPVar6 == (PageAllocatorBaseCommon *)0x0) {
      pAVar13 = (AllocatorType *)0x0;
    }
    lpAddress = (char *)VirtualAllocWrapper::AllocPages
                                  ((VirtualAllocWrapper *)&VirtualAllocWrapper::Instance,(LPVOID)0x0
                                   ,pageCount,allocFlags | 0x2000,4,pAVar13[0x50] == 2);
    this->address = lpAddress;
    if (lpAddress == (char *)0x0) {
      pPVar6 = (this->super_SegmentBaseCommon).allocator;
      pPVar14 = (PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                 *)&pPVar6[-1].allocatorType;
      if (pPVar6 == (PageAllocatorBaseCommon *)0x0) {
        pPVar14 = (PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                   *)0x0;
      }
      PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
      ::ReportFailure(pPVar14,pageCount << 0xc);
    }
    else {
      if ((short)lpAddress != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)*in_FS_OFFSET;
        *puVar4 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                           ,0x86,"(((ULONG_PTR)this->address % (64 * 1024)) == 0)",
                           "((ULONG_PTR)this->address % (64 * 1024)) == 0");
        if (!bVar9) {
LAB_002755ec:
          pcVar7 = (code *)invalidInstructionException();
          (*pcVar7)();
        }
        *puVar4 = 0;
        lpAddress = this->address;
      }
      if (bVar8) {
        if (Js::Configuration::Global[0x5f72] == 1) {
          Output::Print(L"Number of Leading Guard Pages: %d\n",(ulong)this->leadingGuardPageCount);
        }
        if ((Js::Configuration::Global[0x5f72] & 1) != 0) {
          Output::Print(L"Starting address of Leading Guard Pages: 0x%p\n",this->address);
        }
        if ((Js::Configuration::Global[0x5f72] & 1) != 0) {
          Output::Print(L"Offset of Segment Start address: 0x%p\n",
                        this->address + (this->leadingGuardPageCount << 0xc));
        }
        if ((Js::Configuration::Global[0x5f72] & 1) != 0) {
          Output::Print(L"Starting address of Trailing Guard Pages: 0x%p\n",
                        this->address +
                        ((ulong)this->leadingGuardPageCount + this->segmentPageCount) * 0x1000);
        }
        if ((allocFlags >> 0xc & 1) != 0) {
          pPVar6 = (this->super_SegmentBaseCommon).allocator;
          pPVar14 = (PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                     *)&pPVar6[-1].allocatorType;
          if (pPVar6 == (PageAllocatorBaseCommon *)0x0) {
            pPVar14 = (PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                       *)0x0;
          }
          PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
          ::GetVirtualAllocator(pPVar14);
          VirtualAllocWrapper::Free
                    ((VirtualAllocWrapper *)&VirtualAllocWrapper::Instance,this->address,
                     (ulong)(this->leadingGuardPageCount << 0xc),0x4000);
          pPVar6 = (this->super_SegmentBaseCommon).allocator;
          pPVar14 = (PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                     *)&pPVar6[-1].allocatorType;
          if (pPVar6 == (PageAllocatorBaseCommon *)0x0) {
            pPVar14 = (PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                       *)0x0;
          }
          PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
          ::GetVirtualAllocator(pPVar14);
          VirtualAllocWrapper::Free
                    ((VirtualAllocWrapper *)&VirtualAllocWrapper::Instance,
                     this->address +
                     ((ulong)this->leadingGuardPageCount + this->segmentPageCount) * 0x1000,
                     (ulong)(this->trailingGuardPageCount << 0xc),0x4000);
        }
        pPVar6 = (this->super_SegmentBaseCommon).allocator;
        pPVar14 = (PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                   *)&pPVar6[-1].allocatorType;
        if (pPVar6 == (PageAllocatorBaseCommon *)0x0) {
          pPVar14 = (PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                     *)0x0;
        }
        PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
        ::ReportFree(pPVar14,(ulong)((this->trailingGuardPageCount + this->leadingGuardPageCount) *
                                    0x1000));
        this->address = this->address + (this->leadingGuardPageCount << 0xc);
      }
      pPVar6 = (this->super_SegmentBaseCommon).allocator;
      pAVar13 = &pPVar6[-1].allocatorType;
      if (pPVar6 == (PageAllocatorBaseCommon *)0x0) {
        pAVar13 = (AllocatorType *)0x0;
      }
      cVar10 = (**(code **)(*(long *)pAVar13 + 0x30))
                         (pAVar13,this,allocFlags >> 0xc & 1,&this->secondaryAllocator);
      if ((cVar10 != '\0') &&
         (((Js::Configuration::Global[0x2c154] == '\x01' && ((this->field_0x2c & 2) == 0)) ||
          (bVar8 = RecyclerWriteBarrierManager::OnSegmentAlloc(this->address,this->segmentPageCount)
          , bVar8)))) {
        bVar1 = this->field_0x2c;
        this->field_0x2c = bVar1 | 1;
        if ((bVar1 & 2) == 0) {
          return true;
        }
        RecyclerWriteBarrierManager::ToggleBarrier(this->address,this->segmentPageCount << 0xc,true)
        ;
        return true;
      }
      pPVar6 = (this->super_SegmentBaseCommon).allocator;
      pPVar14 = (PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                 *)&pPVar6[-1].allocatorType;
      if (pPVar6 == (PageAllocatorBaseCommon *)0x0) {
        pPVar14 = (PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                   *)0x0;
      }
      PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
      ::GetVirtualAllocator(pPVar14);
      VirtualAllocWrapper::Free
                ((VirtualAllocWrapper *)&VirtualAllocWrapper::Instance,lpAddress,
                 this->segmentPageCount << 0xc,0x8000);
      pPVar6 = (this->super_SegmentBaseCommon).allocator;
      pPVar14 = (PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                 *)&pPVar6[-1].allocatorType;
      if (pPVar6 == (PageAllocatorBaseCommon *)0x0) {
        pPVar14 = (PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                   *)0x0;
      }
      PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
      ::ReportFailure(pPVar14,this->segmentPageCount << 0xc);
      this->address = (char *)0x0;
    }
  }
  return false;
}

Assistant:

bool
SegmentBase<T>::Initialize(DWORD allocFlags, bool excludeGuardPages)
{
    Assert(this->address == nullptr);
    char* originalAddress = nullptr;
    bool addGuardPages = false;
    if (!excludeGuardPages)
    {
        addGuardPages = (this->segmentPageCount * AutoSystemInfo::PageSize) > VirtualAllocThreshold;
#if TARGET_32
        unsigned int randomNumber2 = static_cast<unsigned int>(Math::Rand());
        addGuardPages = addGuardPages && (randomNumber2 % 4 == 1);
#endif
#if DEBUG
        addGuardPages = addGuardPages || Js::Configuration::Global.flags.ForceGuardPages;
#endif
        if (addGuardPages)
        {
            unsigned int randomNumber = static_cast<unsigned int>(Math::Rand());
            this->leadingGuardPageCount = randomNumber % maxGuardPages + minGuardPages;
            this->trailingGuardPageCount = minGuardPages;
        }
    }

    // We can only allocate with this granularity using VirtualAlloc
    size_t totalPages = Math::Align<size_t>(this->segmentPageCount + leadingGuardPageCount + trailingGuardPageCount, AutoSystemInfo::Data.GetAllocationGranularityPageCount());
    this->segmentPageCount = totalPages - (leadingGuardPageCount + trailingGuardPageCount);

#ifdef FAULT_INJECTION
    if (Js::FaultInjection::Global.ShouldInjectFault(Js::FaultInjection::Global.NoThrow))
    {
        this->address = nullptr;
        return false;
    }
#endif

    if (!this->GetAllocator()->RequestAlloc(totalPages * AutoSystemInfo::PageSize))
    {
        return false;
    }

    this->address = (char *)GetAllocator()->GetVirtualAllocator()->AllocPages(NULL, totalPages, MEM_RESERVE | allocFlags, PAGE_READWRITE, this->IsInCustomHeapAllocator());

    if (this->address == nullptr)
    {
        this->GetAllocator()->ReportFailure(totalPages * AutoSystemInfo::PageSize);
        return false;
    }

    Assert( ((ULONG_PTR)this->address % (64 * 1024)) == 0 );

    originalAddress = this->address;
    bool committed = (allocFlags & MEM_COMMIT) != 0;
    if (addGuardPages)
    {
#if DBG_DUMP
        GUARD_PAGE_TRACE(_u("Number of Leading Guard Pages: %d\n"), leadingGuardPageCount);
        GUARD_PAGE_TRACE(_u("Starting address of Leading Guard Pages: 0x%p\n"), address);
        GUARD_PAGE_TRACE(_u("Offset of Segment Start address: 0x%p\n"), this->address + (leadingGuardPageCount*AutoSystemInfo::PageSize));
        GUARD_PAGE_TRACE(_u("Starting address of Trailing Guard Pages: 0x%p\n"), address + ((leadingGuardPageCount + this->segmentPageCount)*AutoSystemInfo::PageSize));
#endif
        if (committed)
        {
            GetAllocator()->GetVirtualAllocator()->Free(address,
              leadingGuardPageCount * AutoSystemInfo::PageSize, MEM_DECOMMIT);

            GetAllocator()->GetVirtualAllocator()->Free(address +
              ((leadingGuardPageCount + this->segmentPageCount) * AutoSystemInfo::PageSize),
              trailingGuardPageCount * AutoSystemInfo::PageSize, MEM_DECOMMIT);
        }
        this->GetAllocator()->ReportFree((leadingGuardPageCount + trailingGuardPageCount) * AutoSystemInfo::PageSize);

        this->address = this->address + (leadingGuardPageCount*AutoSystemInfo::PageSize);
    }

    if (!GetAllocator()->CreateSecondaryAllocator(this, committed, &this->secondaryAllocator))
    {
        GetAllocator()->GetVirtualAllocator()->Free(originalAddress,
          GetPageCount() * AutoSystemInfo::PageSize, MEM_RELEASE);
        this->GetAllocator()->ReportFailure(GetPageCount() * AutoSystemInfo::PageSize);
        this->address = nullptr;
        return false;
    }

#ifdef RECYCLER_WRITE_BARRIER
#if defined(TARGET_64) && defined(RECYCLER_WRITE_BARRIER_BYTE)
    bool registerBarrierResult = true;
#if ENABLE_DEBUG_CONFIG_OPTIONS
    if (CONFIG_FLAG(StrictWriteBarrierCheck))
    {
        if (this->isWriteBarrierEnabled)
        {
            // only commit card table for write barrier pages for strict check
            // we can do this in free build if all write barrier annotated struct
            // only allocate with write barrier pages
            registerBarrierResult = RecyclerWriteBarrierManager::OnSegmentAlloc(this->address, this->segmentPageCount);
        }
    }
    else
#endif
    {
        registerBarrierResult = RecyclerWriteBarrierManager::OnSegmentAlloc(this->address, this->segmentPageCount);
    }

    if (!registerBarrierResult)
    {
        GetAllocator()->GetVirtualAllocator()->Free(originalAddress,
          GetPageCount() * AutoSystemInfo::PageSize, MEM_RELEASE);
        this->GetAllocator()->ReportFailure(GetPageCount() * AutoSystemInfo::PageSize);
        this->address = nullptr;
        return false;
    }
#endif

    this->isWriteBarrierAllowed = true;
#if DBG

    if (this->isWriteBarrierEnabled)
    {
        RecyclerWriteBarrierManager::ToggleBarrier(this->address,
          this->segmentPageCount * AutoSystemInfo::PageSize, true);
    }
#endif
#endif

    return true;
}